

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

int deqp::gles31::Functional::anon_unknown_3::getNumTypeInstances
              (Shader *shader,Storage storage,_func_bool_DataType *predicate)

{
  int iVar1;
  pointer pIVar2;
  pointer pVVar3;
  pointer pIVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  pointer pVVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  InstanceCounter local_40;
  long local_38;
  
  pIVar2 = (shader->m_defaultBlock).interfaceBlocks.
           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (shader->m_defaultBlock).interfaceBlocks.
           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_40.m_predicate = predicate;
  if ((int)((ulong)((long)pIVar4 - (long)pIVar2) >> 4) * 0x38e38e39 < 1) {
    iVar6 = 0;
  }
  else {
    lVar10 = 0;
    iVar6 = 0;
    do {
      if (pIVar2[lVar10].storage == storage) {
        lVar11 = *(long *)&pIVar2[lVar10].dimensions.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data;
        uVar9 = (uint)((ulong)((long)*(pointer *)
                                      ((long)&pIVar2[lVar10].dimensions.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      + 8) - lVar11) >> 2);
        if ((int)uVar9 < 1) {
          iVar5 = 1;
        }
        else {
          iVar5 = 1;
          uVar7 = 0;
          do {
            iVar5 = iVar5 * *(int *)(lVar11 + uVar7 * 4);
            uVar7 = uVar7 + 1;
          } while ((uVar9 & 0x7fffffff) != uVar7);
        }
        lVar11 = *(long *)&pIVar2[lVar10].variables.
                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ._M_impl.super__Vector_impl_data;
        if (0 < (int)((ulong)((long)*(pointer *)
                                     ((long)&pIVar2[lVar10].variables.
                                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                             ._M_impl + 8) - lVar11) >> 5) * -0x55555555) {
          lVar13 = 0x20;
          lVar12 = 0;
          local_38 = lVar10;
          do {
            iVar1 = accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                              ((VarType *)(lVar11 + lVar13),&local_40);
            iVar6 = iVar6 + iVar1 * iVar5;
            lVar12 = lVar12 + 1;
            pIVar2 = (shader->m_defaultBlock).interfaceBlocks.
                     super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar11 = *(long *)&pIVar2[lVar10].variables.
                               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                               ._M_impl.super__Vector_impl_data;
            lVar13 = lVar13 + 0x60;
          } while (lVar12 < (int)((ulong)((long)*(pointer *)
                                                 ((long)&pIVar2[lVar10].variables.
                                                                                                                  
                                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                                  ._M_impl + 8) - lVar11) >> 5) * -0x55555555);
          pIVar4 = (shader->m_defaultBlock).interfaceBlocks.
                   super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          lVar10 = local_38;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)pIVar4 - (long)pIVar2) >> 4) * 0x38e38e39);
  }
  pVVar8 = (shader->m_defaultBlock).variables.
           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (shader->m_defaultBlock).variables.
           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pVVar3 - (long)pVVar8) >> 5) * -0x55555555) {
    lVar10 = 0x20;
    lVar11 = 0;
    do {
      if (*(Storage *)((long)pVVar8 + lVar10 + -8) == storage) {
        iVar5 = accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                          ((VarType *)((long)&(pVVar8->layout).location + lVar10),&local_40);
        iVar6 = iVar6 + iVar5;
        pVVar8 = (shader->m_defaultBlock).variables.
                 super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar3 = (shader->m_defaultBlock).variables.
                 super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x60;
    } while (lVar11 < (int)((ulong)((long)pVVar3 - (long)pVVar8) >> 5) * -0x55555555);
  }
  return iVar6;
}

Assistant:

static int getNumTypeInstances (const ProgramInterfaceDefinition::Shader* shader, glu::Storage storage, bool (*predicate)(glu::DataType))
{
	return accumulateShader(shader, InterfaceBlockStorageFilter(storage), VariableDeclarationStorageFilter(storage), InstanceCounter(predicate));
}